

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerBase::SetAttributes
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attributes)

{
  int *piVar1;
  bool bVar2;
  PropertyIndex index;
  int iVar3;
  BOOL BVar4;
  uint32 uVar5;
  DynamicTypeHandler *pDVar6;
  PropertyRecord *this_00;
  undefined4 extraout_var;
  
  if (attributes < 0x10) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ShareTypesWithAttributesPhase);
    if (!bVar2) {
      index = TypePath::LookupInline
                        ((this->typePath).ptr,propertyId,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      if (index != 0xffff) {
        BVar4 = SetAttributesAtIndex(this,instance,propertyId,index,attributes);
        return BVar4;
      }
      bVar2 = DynamicObject::HasObjectArray(instance);
      if (attributes != '\a' && bVar2) {
        this_00 = ScriptContext::GetPropertyName
                            ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).
                              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
        if (this_00->isNumeric == true) {
          iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x48])(this,instance);
          uVar5 = PropertyRecord::GetNumericValue(this_00);
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x178))
                    ((long *)CONCAT44(extraout_var,iVar3),instance,uVar5,attributes);
        }
      }
      return 1;
    }
  }
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertPathToDictionaryAttributesCount
  ;
  *piVar1 = *piVar1 + 1;
  pDVar6 = TryConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                     (this,instance,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),false)
  ;
  iVar3 = (*pDVar6->_vptr_DynamicTypeHandler[0x3b])
                    (pDVar6,instance,(ulong)(uint)propertyId,attributes,
                     pDVar6->_vptr_DynamicTypeHandler[0x3b]);
  return iVar3;
}

Assistant:

BOOL PathTypeHandlerBase::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        if (!ObjectSlotAttributesContains(attributes) || PHASE_OFF1(ShareTypesWithAttributesPhase))
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryAttributesCount++;
#endif

            return TryConvertToSimpleDictionaryType(instance, GetPathLength())->SetAttributes(instance, propertyId, attributes);
        }

        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            if (instance->HasObjectArray() && attributes != PropertyDynamicTypeDefaults)
            {
                const PropertyRecord * propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
                if (propertyRecord->IsNumeric())
                {
                    this->ConvertToTypeWithItemAttributes(instance)->SetItemAttributes(instance, propertyRecord->GetNumericValue(), attributes);
                }
            }
            return true;
        }

        return SetAttributesAtIndex(instance, propertyId, propertyIndex, attributes);
    }